

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_ptr.hpp
# Opt level: O3

shared_ptr<nestl::impl::set<void_*,_std::less<void_*>,_nestl::allocator<void_*>_>_>
nestl::impl::
make_shared_a_nothrow<nestl::impl::set<void*,std::less<void*>,nestl::allocator<void*>>,nestl::has_exceptions::exception_ptr_error,nestl::allocator<nestl::impl::set<void*,std::less<void*>,nestl::allocator<void*>>>>
          (exception_ptr_error *err,
          allocator<nestl::impl::set<void_*,_std::less<void_*>,_nestl::allocator<void_*>_>_>
          *param_2)

{
  undefined1 *puVar1;
  pointer ptVar2;
  shared_count_base *extraout_RDX;
  shared_count_base *extraout_RDX_00;
  shared_count_base *psVar3;
  shared_ptr<nestl::impl::set<void_*,_std::less<void_*>,_nestl::allocator<void_*>_>_> sVar4;
  SharedCountAllocator sharedCountAlloc;
  allocator<nestl::impl::type_stored_by_value<nestl::impl::set<void_*,_std::less<void_*>,_nestl::allocator<void_*>_>,_nestl::allocator<nestl::impl::set<void_*,_std::less<void_*>,_nestl::allocator<void_*>_>_>_>_>
  local_11;
  
  ptVar2 = allocator<nestl::impl::type_stored_by_value<nestl::impl::set<void_*,_std::less<void_*>,_nestl::allocator<void_*>_>,_nestl::allocator<nestl::impl::set<void_*,_std::less<void_*>,_nestl::allocator<void_*>_>_>_>_>
           ::allocate<nestl::has_exceptions::exception_ptr_error>
                     (&local_11,(exception_ptr_error *)param_2,1,(void *)0x0);
  if (*(long *)param_2 != 0) {
    (err->m_exception)._M_exception_object = (void *)0x0;
    err[1].m_exception._M_exception_object = (void *)0x0;
    psVar3 = extraout_RDX;
    goto LAB_00105f06;
  }
  (ptVar2->super_shared_count_base).m_use_count = 0;
  (ptVar2->super_shared_count_base).m_weak_use_count = 0;
  (ptVar2->super_shared_count_base)._vptr_shared_count_base =
       (_func_int **)&PTR__type_stored_by_value_00109d58;
  (ptVar2->m_value).m_storage.__align = (anon_struct_8_0_00000001_for___align)0x0;
  *(undefined8 *)((long)&(ptVar2->m_value).m_storage + 8) = 0;
  *(undefined8 *)((long)&(ptVar2->m_value).m_storage + 0x10) = 0;
  *(undefined8 *)((long)&(ptVar2->m_value).m_storage + 0x18) = 0;
  *(undefined8 *)((long)&(ptVar2->m_value).m_storage + 0x20) = 0;
  *(undefined8 *)((long)&(ptVar2->m_value).m_storage + 0x28) = 0;
  if (*(long *)param_2 == 0) {
    puVar1 = (undefined1 *)((long)&(ptVar2->m_value).m_storage + 8);
    *(undefined8 *)((long)&(ptVar2->m_value).m_storage + 0x18) = 0;
    *(undefined8 *)((long)&(ptVar2->m_value).m_storage + 0x20) = 0;
    *(undefined8 *)((long)&(ptVar2->m_value).m_storage + 8) = 0;
    *(undefined8 *)((long)&(ptVar2->m_value).m_storage + 0x10) = 0;
    *(undefined8 *)((long)&(ptVar2->m_value).m_storage + 0x28) = 0;
    *(undefined1 **)((long)&(ptVar2->m_value).m_storage + 0x18) = puVar1;
    *(undefined1 **)((long)&(ptVar2->m_value).m_storage + 0x20) = puVar1;
    if (*(long *)param_2 != 0) goto LAB_00105efb;
    (err->m_exception)._M_exception_object = &ptVar2->m_value;
    err[1].m_exception._M_exception_object = ptVar2;
    (ptVar2->super_shared_count_base).m_use_count = 1;
    ptVar2 = (pointer)0x0;
  }
  else {
LAB_00105efb:
    (err->m_exception)._M_exception_object = (void *)0x0;
    err[1].m_exception._M_exception_object = (void *)0x0;
  }
  operator_delete(ptVar2);
  psVar3 = extraout_RDX_00;
LAB_00105f06:
  sVar4.m_refcount = psVar3;
  sVar4.m_ptr = (element_type *)err;
  return sVar4;
}

Assistant:

shared_ptr<T> make_shared_a_nothrow(OperationError& err, Allocator& /* alloc */, Args&& ... args)
{
    static_assert(sizeof(T), "T must be complete type");
    typedef type_stored_by_value<T, Allocator> shared_count_t;
    typedef typename shared_count_t::allocator_type SharedCountAllocator;
    SharedCountAllocator sharedCountAlloc;

    shared_count_t* ptr = allocator_traits<SharedCountAllocator>::allocate(err, sharedCountAlloc, 1);
    if (err)
    {
        return {nullptr};
    }
    nestl::detail::deallocation_scoped_guard<shared_count_t*, SharedCountAllocator> deallocationGuard(sharedCountAlloc, ptr, 1);

    nestl::class_operations::construct(err, ptr, sharedCountAlloc);
    if (err)
    {
        return {nullptr};
    }

    ptr->initialize(err, std::forward<Args>(args) ...);
    if (err)
    {
        return {nullptr};
    }

    deallocationGuard.release();
    return shared_ptr<T>(ptr->get(), ptr);
}